

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::cni_holder(cni_holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *this,_func_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                   **func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_00246b90;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object =
       (_func_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
        *)0x0;
  local_28._8_8_ = 0;
  if (*func != (_func_deque<cs_impl::any,_std::allocator<cs_impl::any>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *)0x0) {
    pcStack_10 = std::
                 _Function_handler<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)*func;
  }
  std::
  function<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&(this->mCni).mFunc,
             (function<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}